

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
TeamChangeIRCCommand::trigger
          (TeamChangeIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  PlayerInfo *pPVar4;
  size_t sVar5;
  char *pcVar6;
  undefined8 uVar7;
  char *pcVar8;
  uint uVar9;
  size_type *psVar10;
  size_type *psVar11;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  char *local_58;
  
  pcVar8 = channel._M_str;
  if (parameters._M_len == 0) {
    pcVar8 = "Error: Too Few Parameters. Syntax: team <player>";
    uVar7 = 0x30;
LAB_001319b5:
    Jupiter::IRC::Client::sendNotice(source,nick._M_len,nick._M_str,uVar7,pcVar8);
    return;
  }
  pcVar6 = pcVar8;
  lVar2 = Jupiter::IRC::Client::getChannel(source,channel._M_len,pcVar8);
  if (lVar2 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    uVar9 = 0;
    local_58 = (char *)0x0;
    while( true ) {
      RenX::getCore();
      uVar3 = RenX::Core::getServerCount();
      if (uVar3 == uVar9) break;
      uVar3 = RenX::getCore();
      pPVar4 = (PlayerInfo *)RenX::Core::getServer(uVar3);
      cVar1 = RenX::Server::isLogChanType((int)pPVar4);
      if ((cVar1 != '\0') && (*(long *)((long)&(pPVar4->name).field_2 + 8) != 0)) {
        psVar11 = &(pPVar4->name)._M_string_length;
        psVar10 = psVar11;
        while (psVar10 = (size_type *)*psVar10, psVar10 != psVar11) {
          rhs._M_str = pcVar6;
          rhs._M_len = (size_t)parameters._M_str;
          sVar5 = jessilib::findi<char,char>
                            ((jessilib *)(psVar10 + 3),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             parameters._M_len,rhs);
          if (sVar5 != 0xffffffffffffffff) {
            cVar1 = RenX::Server::changeTeam(pPVar4,(bool)((char)psVar10 + '\x10'));
            local_58 = (char *)CONCAT71((int7)((ulong)pcVar6 >> 8),1);
            pcVar6 = local_58;
            if (cVar1 == '\0') {
              pcVar6 = (char *)0x2d;
              Jupiter::IRC::Client::sendMessage
                        (source,channel._M_len,pcVar8,0x2d,
                         "Error: Server does not support team changing.");
            }
          }
        }
      }
      uVar9 = uVar9 + 1;
    }
    if (((ulong)local_58 & 1) == 0) {
      pcVar8 = "Error: Player not found.";
      uVar7 = 0x18;
      goto LAB_001319b5;
    }
  }
  return;
}

Assistant:

void TeamChangeIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	if (!parameters.empty()) {
		Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
		if (chan != nullptr) {
			int type = chan->getType();
			std::string_view playerName = std::string_view{parameters};
			bool playerFound = false;
			for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++) {
				RenX::Server *server = RenX::getCore()->getServer(i);
				if (server->isLogChanType(type) && server->players.size() != 0) {
					for (auto node = server->players.begin(); node != server->players.end(); ++node) {
						if (jessilib::findi(node->name, playerName) != std::string::npos) {
							playerFound = true;
							if (!server->changeTeam(*node)) {
								source->sendMessage(channel, "Error: Server does not support team changing."sv);
							}
						}
					}
				}
			}
			if (playerFound == false)
				source->sendNotice(nick, "Error: Player not found."sv);
		}
	}
	else source->sendNotice(nick, "Error: Too Few Parameters. Syntax: team <player>"sv);
}